

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hex.c
# Opt level: O2

void test_hex_encode(void)

{
  int iVar1;
  char blob [17];
  char buffer [256];
  
  blob[0] = '\0';
  blob[1] = '\x01';
  blob[2] = '\x02';
  blob[3] = '\x03';
  blob[4] = '\x04';
  blob[5] = '\x05';
  blob[6] = '\x06';
  blob[7] = '\a';
  blob[8] = '\b';
  blob[9] = '\t';
  blob[10] = '\n';
  blob[0xb] = '\v';
  blob[0xc] = '\f';
  blob[0xd] = '\r';
  blob[0xe] = '\x0e';
  blob[0xf] = '\x0f';
  blob[0x10] = -1;
  iVar1 = hex_encode(blob,0x11,buffer,0x100,1);
  acutest_check_((uint)(iVar1 == 0x22),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x28,"%s",
                 "hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 1) == strlen(expect_lower)"
                );
  iVar1 = bcmp(buffer,"000102030405060708090a0b0c0d0e0fff",0x23);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x29,"%s");
  iVar1 = hex_encode(blob,0x11,buffer,0x100,0);
  acutest_check_((uint)(iVar1 == 0x22),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x2b,"%s",
                 "hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 0) == strlen(expect_upper)"
                );
  iVar1 = bcmp(buffer,"000102030405060708090A0B0C0D0E0FFF",0x23);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x2c,"%s","strcmp(buffer, expect_upper) == 0");
  return;
}

Assistant:

static void
test_hex_encode(void)
{
    char blob[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 0xff };
    char buffer[256];
    char expect_lower[] = "000102030405060708090a0b0c0d0e0fff";
    char expect_upper[] = "000102030405060708090A0B0C0D0E0FFF";

    TEST_CHECK(hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 1) == strlen(expect_lower));
    TEST_CHECK(strcmp(buffer, expect_lower) == 0);

    TEST_CHECK(hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 0) == strlen(expect_upper));
    TEST_CHECK(strcmp(buffer, expect_upper) == 0);
}